

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_get.c
# Opt level: O0

void * linkedlist_get(s_linkedlist *linked_list,uint index)

{
  s_linkedlist_node *local_28;
  s_linkedlist_node *node;
  uint index_local;
  s_linkedlist *linked_list_local;
  
  local_28 = linked_list->head;
  node._4_4_ = index;
  while( true ) {
    if (local_28 == (s_linkedlist_node *)0x0) {
      return (void *)0x0;
    }
    if (node._4_4_ == 0) break;
    node._4_4_ = node._4_4_ - 1;
    local_28 = local_28->next;
  }
  return local_28->element;
}

Assistant:

void *linkedlist_get(s_linkedlist *linked_list, unsigned int index) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (index == 0) {
            return (node->element);
        }

        index -= 1;
        node = node->next;
    }

    return (NULL);
}